

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ElabSystemTaskSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElabSystemTaskSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ArgumentListSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ArgumentListSyntax **args_2,Token *args_3)

{
  Info *pIVar1;
  ArgumentListSyntax *pAVar2;
  size_type sVar3;
  pointer ppAVar4;
  Info *pIVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  ElabSystemTaskSyntax *pEVar16;
  long lVar17;
  
  pEVar16 = (ElabSystemTaskSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ElabSystemTaskSyntax *)this->endPtr < pEVar16 + 1) {
    pEVar16 = (ElabSystemTaskSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(pEVar16 + 1);
  }
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar1 = args_1->info;
  pAVar2 = *args_2;
  TVar12 = args_3->kind;
  uVar13 = args_3->field_0x2;
  NVar14.raw = (args_3->numFlags).raw;
  uVar15 = args_3->rawLen;
  pIVar5 = args_3->info;
  (pEVar16->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar16->super_MemberSyntax).super_SyntaxNode.kind = ElabSystemTask;
  SVar6 = (args->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar7 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (pEVar16->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pEVar16->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar6;
  *(undefined4 *)
   &(pEVar16->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar7
  ;
  (pEVar16->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (pEVar16->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar3 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).size_
  ;
  (pEVar16->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).data_;
  (pEVar16->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar3;
  (pEVar16->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (pEVar16->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pEVar16;
  sVar3 = (pEVar16->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar3 != 0) {
    ppAVar4 = (pEVar16->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar17 = 0;
    do {
      **(undefined8 **)((long)ppAVar4 + lVar17) = pEVar16;
      lVar17 = lVar17 + 8;
    } while (sVar3 << 3 != lVar17);
  }
  (pEVar16->name).kind = TVar8;
  (pEVar16->name).field_0x2 = uVar9;
  (pEVar16->name).numFlags = (NumericTokenFlags)NVar10.raw;
  (pEVar16->name).rawLen = uVar11;
  (pEVar16->name).info = pIVar1;
  pEVar16->arguments = pAVar2;
  (pEVar16->semi).kind = TVar12;
  (pEVar16->semi).field_0x2 = uVar13;
  (pEVar16->semi).numFlags = (NumericTokenFlags)NVar14.raw;
  (pEVar16->semi).rawLen = uVar15;
  (pEVar16->semi).info = pIVar5;
  if (pAVar2 != (ArgumentListSyntax *)0x0) {
    (pAVar2->super_SyntaxNode).parent = (SyntaxNode *)pEVar16;
  }
  return pEVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }